

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmStop<(moira::Instr)118,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  
  *addr = *addr + 2;
  iVar3 = (*this->_vptr_Moira[6])();
  cVar4 = 's';
  lVar5 = 0;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = "lpstop"[lVar5 + 3];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  pcVar2 = str->ptr;
  str->ptr = pcVar2 + 1;
  *pcVar2 = '#';
  StrWriter::operator<<(str,(Int)(int)(short)iVar3);
  return;
}

Assistant:

void
Moira::dasmStop(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);

    str << Ins<I>{} << str.tab << Ims<S>(src);
}